

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall kj::parse::anon_unknown_0::TestCase505::run(TestCase505 *this)

{
  IteratorInput<char,_const_char_*> local_20;
  
  local_20.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_20.end = "";
  local_20.best = "a";
  local_20.pos = "";
  IteratorInput<char,_const_char_*>::~IteratorInput(&local_20);
  return;
}

Assistant:

TEST(CommonParsers, EndOfInput) {
  auto parser = endOfInput;

  {
    StringPtr text = "a";
    Input input(text.begin(), text.end());
    EXPECT_TRUE(parser(input) == nullptr);
    EXPECT_TRUE(parser(input) == nullptr);
    input.next();
    EXPECT_FALSE(parser(input) == nullptr);
  }
}